

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_sse.c
# Opt level: O1

parasail_profile_t *
parasail_profile_create_stats_sse_128_64(char *s1,int _s1Len,parasail_matrix_t *matrix)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  parasail_profile_t *ppVar6;
  ulong uVar7;
  size_t size;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  byte *pbVar16;
  __m128i_64_t p;
  __m128i_64_t s;
  __m128i_64_t m;
  ulong local_68 [4];
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (matrix == (parasail_matrix_t *)0x0) {
    parasail_profile_create_stats_sse_128_64_cold_2();
  }
  else if (s1 == (char *)0x0) {
    parasail_profile_create_stats_sse_128_64_cold_1();
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
    }
    uVar1 = matrix->size;
    uVar15 = (_s1Len - (_s1Len + 1 >> 0x1f)) + 1 >> 1;
    size = (long)(int)(uVar15 * uVar1) << 4;
    pvVar3 = parasail_memalign(0x10,size);
    if ((((pvVar3 != (void *)0x0) && (pvVar4 = parasail_memalign(0x10,size), pvVar4 != (void *)0x0))
        && (pvVar5 = parasail_memalign(0x10,size), pvVar5 != (void *)0x0)) &&
       (ppVar6 = parasail_profile_new(s1,_s1Len,matrix), ppVar6 != (parasail_profile_t *)0x0)) {
      if (0 < (int)uVar1) {
        uVar7 = 1;
        if (1 < (int)uVar15) {
          uVar7 = (ulong)uVar15;
        }
        uVar8 = 0;
        lVar10 = 0;
        do {
          if (0 < _s1Len) {
            lVar10 = (long)(int)lVar10;
            uVar11 = 0;
            do {
              iVar2 = matrix->type;
              lVar14 = 0;
              uVar13 = uVar11;
              do {
                iVar12 = (int)uVar13;
                if (iVar2 == 0) {
                  if (iVar12 < _s1Len) {
                    pbVar16 = (byte *)(s1 + uVar13);
                    uVar9 = uVar8;
                    goto LAB_005a01ea;
                  }
LAB_005a020b:
                  uVar9 = 0;
                }
                else {
                  if (_s1Len <= iVar12) goto LAB_005a020b;
                  pbVar16 = (byte *)(matrix->alphabet + uVar8);
                  uVar9 = uVar13;
LAB_005a01ea:
                  uVar9 = (ulong)matrix->matrix
                                 [(long)(int)((int)uVar9 * uVar1) + (long)matrix->mapper[*pbVar16]];
                }
                local_68[lVar14] = uVar9;
                if (iVar12 < _s1Len) {
                  uVar9 = (ulong)(uVar8 == (uint)matrix->mapper[(byte)s1[uVar13]]);
                }
                else {
                  uVar9 = 0;
                }
                local_68[lVar14 + 4] = uVar9;
                local_68[lVar14 + 2] = (ulong)(0 < (long)local_68[lVar14]);
                uVar13 = uVar13 + uVar15;
                lVar14 = lVar14 + 1;
              } while (lVar14 == 1);
              lVar14 = lVar10 * 0x10;
              *(ulong *)((long)pvVar3 + lVar14) = local_68[0];
              ((ulong *)((long)pvVar3 + lVar14))[1] = local_68[1];
              *(undefined8 *)((long)pvVar4 + lVar14) = local_48;
              ((undefined8 *)((long)pvVar4 + lVar14))[1] = uStack_40;
              *(undefined8 *)((long)pvVar5 + lVar14) = local_68[2];
              ((undefined8 *)((long)pvVar5 + lVar14))[1] = local_68[3];
              lVar10 = lVar10 + 1;
              uVar11 = uVar11 + 1;
            } while (uVar11 != uVar7);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar1);
      }
      (ppVar6->profile64).score = pvVar3;
      (ppVar6->profile64).matches = pvVar4;
      (ppVar6->profile64).similar = pvVar5;
      ppVar6->free = parasail_free___m128i;
      return ppVar6;
    }
  }
  return (parasail_profile_t *)0x0;
}

Assistant:

parasail_profile_t * parasail_profile_create_stats_sse_128_64(
        const char * const restrict s1, const int _s1Len,
        const parasail_matrix_t *matrix)
{
    int s1Len = 0;
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t segNum = 0;
    int32_t n = 0;
    const int32_t segWidth = 2; /* number of values in vector unit */
    int32_t segLen = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict vProfileM = NULL;
    __m128i* restrict vProfileS = NULL;
    int32_t index = 0;
    parasail_profile_t *profile = NULL;

    PARASAIL_CHECK_NULL(matrix);
    /* s1 is required for both pssm and square */
    PARASAIL_CHECK_NULL(s1);

    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    n = matrix->size; /* number of amino acids in table */
    segLen = (s1Len + segWidth - 1) / segWidth;
    vProfile = parasail_memalign___m128i(16, n * segLen);
    if (!vProfile) return NULL;
    vProfileM = parasail_memalign___m128i(16, n * segLen);
    if (!vProfileM) return NULL;
    vProfileS = parasail_memalign___m128i(16, n * segLen);
    if (!vProfileS) return NULL;
    profile = parasail_profile_new(s1, s1Len, matrix);
    if (!profile) return NULL;

    for (k=0; k<n; ++k) {
        for (i=0; i<segLen; ++i) {
            __m128i_64_t p;
            __m128i_64_t m;
            __m128i_64_t s;
            j = i;
            for (segNum=0; segNum<segWidth; ++segNum) {
                if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*k+matrix->mapper[(unsigned char)s1[j]]];
                }
                else {
                    p.v[segNum] = j >= s1Len ? 0 : matrix->matrix[n*j+matrix->mapper[(unsigned char)matrix->alphabet[k]]];
                }
                m.v[segNum] = j >= s1Len ? 0 : (k == matrix->mapper[(unsigned char)s1[j]]);
                s.v[segNum] = p.v[segNum] > 0;
                j += segLen;
            }
            _mm_store_si128(&vProfile[index], p.m);
            _mm_store_si128(&vProfileM[index], m.m);
            _mm_store_si128(&vProfileS[index], s.m);
            ++index;
        }
    }

    profile->profile64.score = vProfile;
    profile->profile64.matches = vProfileM;
    profile->profile64.similar = vProfileS;
    profile->free = &parasail_free___m128i;
    return profile;
}